

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

code_int getcode(FILE *ifp)

{
  Byte BVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  
  if ((long)offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mjwoodcock[P]nspark/compress.c"
                  ,0x1a4,"code_int getcode(FILE *)");
  }
  if ((maxcode < free_ent || (clear_flg & 1) != 0) || size <= (ulong)(long)offset) {
    if (maxcode < free_ent) {
      n_bits = n_bits + 1;
      maxcode = maxmaxcode;
      if (n_bits != maxbits) {
        maxcode = ~(-1 << ((byte)n_bits & 0x1f));
      }
    }
    if ((clear_flg & 1) != 0) {
      n_bits = 9;
      maxcode = 0x1ff;
      clear_flg = 0;
    }
    if (readsize == 0) {
      return -1;
    }
    uVar2 = n_bits;
    if (readsize < n_bits) {
      uVar2 = (uint)readsize;
    }
    if ((int)uVar2 < 0) {
      __assert_fail("tmp_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mjwoodcock[P]nspark/compress.c"
                    ,0x1bb,"code_int getcode(FILE *)");
    }
    size = fread(getcode::buf,1,(ulong)(uVar2 & 0x7fffffff),(FILE *)ifp);
    if (size == 0) {
      return -1;
    }
    for (uVar4 = 0; uVar4 < size; uVar4 = uVar4 + 1) {
      BVar1 = ungarble(getcode::buf[uVar4]);
      getcode::buf[uVar4] = BVar1;
    }
    readsize = readsize - size;
    size = (size * 8 - (long)n_bits) + 1;
    offset = 0;
  }
  uVar4 = (ulong)((uint)offset >> 3);
  uVar2 = offset & 7;
  uVar5 = (uint)(getcode::buf[uVar4] >> (sbyte)uVar2);
  iVar3 = 8 - uVar2;
  iVar7 = n_bits - iVar3;
  if (iVar7 < 8) {
    pbVar6 = getcode::buf + uVar4 + 1;
  }
  else {
    pbVar6 = getcode::buf + uVar4 + 2;
    uVar5 = uVar5 | (uint)getcode::buf[uVar4 + 1] << ((byte)iVar3 & 0x1f);
    iVar3 = 0x10 - uVar2;
    iVar7 = iVar7 + -8;
  }
  offset = n_bits + offset;
  return (uint)(""[iVar7] & *pbVar6) << ((byte)iVar3 & 0x1f) | uVar5;
}

Assistant:

static code_int
getcode(FILE *ifp)
{
	register code_int code;
	static char_type buf[COMPRESSBITS];
	register int r_off, bits;
	size_t i;
	/* BB changed next line. We are doing pointer-artithmatics
	   and that can be dangerous if other than normalized (huge)
	   pointers are being used. */
	register char_type NSHUGE *bp = buf;

	assert(offset >= 0);

	if (clear_flg > 0 || (size_t) offset >= size || free_ent > maxcode)
	{
		int tmp_size;
		/*
		 * If the next entry will be too big for the current code
		 * size, then we must increase the size.  This implies
		 * reading a new buffer full, too.
		 */
		if (free_ent > maxcode)
		{
			n_bits++;
			maxcode = n_bits == maxbits ? maxmaxcode : MAXCODE(n_bits);
		}
		if (clear_flg > 0)
		{
			maxcode = MAXCODE(n_bits = INIT_BITS);
			clear_flg = 0;
		}
		if (readsize == 0)
			return (-1);
		tmp_size = readsize < n_bits ? readsize : n_bits;
		assert(tmp_size >= 0);
		size = fread(buf, 1, tmp_size, ifp);
		if (size == 0)
			return (-1);		/* end of file */
		for (i = 0; i < size; i++)
		{
			buf[i] = ungarble(buf[i]);
		}
		readsize -= size;
		offset = 0;
		/* Round size down to integral number of codes */
		size = (size << 3) - (n_bits - 1);
	}
	r_off = (int)offset;
	bits = n_bits;

	/*
	 * Get to the first byte.
	 */
	bp += (r_off >> 3);
	r_off &= 7;
	/* Get first part (low order bits) */

	code = (*bp++ >> r_off);
	bits -= (8 - r_off);
	r_off = 8 - r_off;			/* now, offset into code word */
	/* Get any 8 bit parts in the middle (<=1 for up to 16 bits). */
	if (bits >= 8)
	{
		code |= *bp++ << r_off;
		r_off += 8;
		bits -= 8;
	}
	/* high order bits. */
	code |= (*bp & rmask[bits]) << r_off;
	offset += n_bits;

	return (code);
}